

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_13161f6::HBDMinMaxTest_MinValue_Test::TestBody(HBDMinMaxTest_MinValue_Test *this)

{
  bool bVar1;
  void *pvVar2;
  int *in_RDI;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  RegisterStateCheckMMX reg_check_mmx;
  RegisterStateCheck reg_check;
  int max;
  int min;
  int i;
  uint8_t *b;
  uint8_t *a;
  AssertHelper *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  char *in_stack_ffffffffffffff70;
  Type in_stack_ffffffffffffff7c;
  AssertHelper *in_stack_ffffffffffffff80;
  AssertionResult local_68 [2];
  undefined1 local_42 [10];
  Message *in_stack_ffffffffffffffc8;
  AssertHelper *in_stack_ffffffffffffffd0;
  undefined1 local_24 [4];
  undefined1 local_20 [4];
  int local_1c;
  ulong local_18;
  ulong local_10;
  
  pvVar2 = aom_malloc(0xbc3826);
  local_10 = (ulong)pvVar2 >> 1;
  pvVar2 = aom_malloc(0xbc383b);
  local_18 = (ulong)pvVar2 >> 1;
  for (local_1c = 0; local_1c < 0x40; local_1c = local_1c + 1) {
    aom_memset16((void *)(local_10 << 1),0,0x40);
    aom_memset16((void *)(local_18 << 1),0xffff,0x40);
    *(short *)(local_18 * 2 + (long)local_1c * 2) = (short)local_1c;
    libaom_test::RegisterStateCheckMMX::RegisterStateCheckMMX
              ((RegisterStateCheckMMX *)&local_68[2].field_0x6);
    (**(code **)(in_RDI + 6))(local_10,8,local_18,8,local_20,local_24);
    libaom_test::RegisterStateCheckMMX::~RegisterStateCheckMMX((RegisterStateCheckMMX *)0xbc38f9);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               in_stack_ffffffffffffff60,in_RDI,(int *)in_stack_ffffffffffffff50);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(local_68);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff80);
      in_stack_ffffffffffffff50 =
           (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xbc396e);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70,
                 in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff50);
      testing::Message::~Message((Message *)0xbc39bc);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc3a0c);
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((char *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
               in_stack_ffffffffffffff60,in_RDI,(int *)in_stack_ffffffffffffff50);
    bVar1 = testing::AssertionResult::operator_cast_to_bool
                      ((AssertionResult *)&stack0xffffffffffffff70);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff80);
      testing::AssertionResult::failure_message((AssertionResult *)0xbc3a6e);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff70,
                 in_stack_ffffffffffffff6c,in_stack_ffffffffffffff60);
      testing::internal::AssertHelper::operator=
                (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff50);
      testing::Message::~Message((Message *)0xbc3aba);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0xbc3b0a);
  }
  aom_free(in_stack_ffffffffffffff50);
  aom_free(in_stack_ffffffffffffff50);
  return;
}

Assistant:

TEST_P(HBDMinMaxTest, MinValue) {
  uint8_t *a = CONVERT_TO_BYTEPTR(
      reinterpret_cast<uint16_t *>(aom_malloc(64 * sizeof(uint16_t))));
  uint8_t *b = CONVERT_TO_BYTEPTR(
      reinterpret_cast<uint16_t *>(aom_malloc(64 * sizeof(uint16_t))));
  for (int i = 0; i < 64; i++) {
    aom_memset16(CONVERT_TO_SHORTPTR(a), 0, 64);
    aom_memset16(CONVERT_TO_SHORTPTR(b), 65535, 64);
    CONVERT_TO_SHORTPTR(b)[i] = i;  // Set a minimum difference of i.

    int min, max;
    API_REGISTER_STATE_CHECK(mm_func_(a, 8, b, 8, &min, &max));
    EXPECT_EQ(65535, max);
    EXPECT_EQ(i, min);
  }
  aom_free(CONVERT_TO_SHORTPTR(a));
  aom_free(CONVERT_TO_SHORTPTR(b));
}